

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::HashMessageRequest,cfd::js::api::json::HexData,cfd::js::api::HashMessageRequestStruct,cfd::js::api::HexDataStruct>
          (json *this,string *request_message,
          function<cfd::js::api::HexDataStruct_(const_cfd::js::api::HashMessageRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_520;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_468 [4];
  JsonClassBase<cfd::js::api::json::HexData> local_448 [4];
  undefined1 local_428 [8];
  HexData res_2;
  undefined1 local_3c8 [8];
  HexDataStruct response;
  HashMessageRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_a0 [8];
  HashMessageRequest req;
  function<cfd::js::api::HexDataStruct_(const_cfd::js::api::HashMessageRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._120_8_ = call_function;
  HashMessageRequest::HashMessageRequest((HashMessageRequest *)local_a0);
  core::JsonClassBase<cfd::js::api::json::HashMessageRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::HashMessageRequest> *)local_a0,request_message);
  HashMessageRequest::ConvertToStruct
            ((HashMessageRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (HashMessageRequest *)local_a0);
  std::function<cfd::js::api::HexDataStruct_(const_cfd::js::api::HashMessageRequestStruct_&)>::
  operator()((HexDataStruct *)local_3c8,call_function,
             (HashMessageRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    HexData::HexData((HexData *)local_428);
    HexData::ConvertFromStruct((HexData *)local_428,(HexDataStruct *)local_3c8);
    core::JsonClassBase<cfd::js::api::json::HexData>::Serialize_abi_cxx11_(local_448);
    std::__cxx11::string::operator=((string *)this,(string *)local_448);
    std::__cxx11::string::~string((string *)local_448);
    HexData::~HexData((HexData *)local_428);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_520,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_468);
    std::__cxx11::string::operator=((string *)this,(string *)local_468);
    std::__cxx11::string::~string((string *)local_468);
    ErrorResponse::~ErrorResponse(&local_520);
  }
  res_2._87_1_ = 1;
  HexDataStruct::~HexDataStruct((HexDataStruct *)local_3c8);
  HashMessageRequestStruct::~HashMessageRequestStruct
            ((HashMessageRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  HashMessageRequest::~HashMessageRequest((HashMessageRequest *)local_a0);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}